

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O1

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBuffer::prepareResources
          (MemoryQualifierInstanceBuffer *this,VkDeviceSize bufferSizeInBytes)

{
  MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_00;
  VkBuffer buffer;
  VkBufferView obj;
  VkFormat format;
  VkDevice device;
  DeviceInterface *vk;
  Allocator *allocator;
  Buffer *this_01;
  VkBufferCreateInfo bufferCreateInfo;
  undefined1 local_a8 [16];
  VkDevice local_98;
  VkAllocationCallbacks *pVStack_90;
  Move<vk::Handle<(vk::HandleType)12>_> local_88;
  VkBufferCreateInfo local_68;
  
  device = Context::getDevice((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context
                             );
  vk = Context::getDeviceInterface
                 ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  makeBufferCreateInfo(&local_68,bufferSizeInBytes,8);
  this_01 = (Buffer *)operator_new(0x30);
  image::Buffer::Buffer(this_01,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  local_a8._0_8_ = (Buffer *)0x0;
  if ((this->super_MemoryQualifierInstanceBase).m_buffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr !=
      this_01) {
    this_00 = &(this->super_MemoryQualifierInstanceBase).m_buffer;
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&this_00->
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
    (this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data.
    ptr = this_01;
  }
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
            ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)local_a8);
  buffer.m_internal =
       (((this->super_MemoryQualifierInstanceBase).m_buffer.
         super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr)->
       m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  format = ::vk::mapTextureFormat(&(this->super_MemoryQualifierInstanceBase).m_format);
  makeBufferView(&local_88,vk,device,buffer,format,0,bufferSizeInBytes);
  local_98 = local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  pVStack_90 = local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_a8._0_8_ = local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_a8._8_8_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&(this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               obj);
  }
  (this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_98;
  (this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       pVStack_90;
  (this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_a8._0_8_;
  (this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_a8._8_8_;
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_88.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void MemoryQualifierInstanceBuffer::prepareResources (const VkDeviceSize bufferSizeInBytes)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();
	Allocator&				allocator		= m_context.getDefaultAllocator();

	// Create a buffer to store shader output
	const VkBufferCreateInfo bufferCreateInfo = makeBufferCreateInfo(bufferSizeInBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT);
	m_buffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, bufferCreateInfo, MemoryRequirement::HostVisible));

	m_bufferView = makeBufferView(deviceInterface, device, m_buffer->get(), mapTextureFormat(m_format), 0ull, bufferSizeInBytes);
}